

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O1

int * floor1_fit(vorbis_block *vb,vorbis_look_floor1 *look,float *logmdct,float *logmask)

{
  float *pfVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint *puVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  vorbis_look_floor1 *pvVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  vorbis_info_floor1 *pvVar26;
  lsfit_acc *a;
  int hy0;
  int ly1;
  int hy1;
  int ly0;
  int y1;
  int y0;
  int fit_valueB [65];
  int fit_valueA [65];
  int hineighbor [65];
  int loneighbor [65];
  int memo [65];
  lsfit_acc fits [64];
  uint local_140c;
  uint local_1408;
  uint local_1404;
  uint local_1400;
  uint local_13fc;
  vorbis_look_floor1 *local_13f8;
  float *local_13f0;
  long local_13e8;
  float *local_13e0;
  vorbis_info_floor1 *local_13d8;
  int local_13cc;
  uint local_13c8;
  int local_13c4;
  long local_13c0;
  vorbis_block *local_13b8;
  long local_13b0;
  long local_13a8;
  long local_13a0;
  long local_1398;
  uint local_1390;
  uint local_138c;
  uint local_1388 [68];
  uint local_1278 [67];
  int aiStack_116c [69];
  int local_1058 [68];
  int local_f48 [68];
  lsfit_acc local_e38 [64];
  
  iVar12 = look->posts;
  lVar24 = (long)iVar12;
  if (0 < lVar24) {
    lVar8 = 0;
    do {
      local_1278[lVar8] = 0xffffff38;
      lVar8 = lVar8 + 1;
    } while (lVar24 != lVar8);
  }
  if (0 < iVar12) {
    lVar8 = 0;
    do {
      local_1388[lVar8] = 0xffffff38;
      lVar8 = lVar8 + 1;
    } while (lVar24 != lVar8);
  }
  pvVar26 = look->vi;
  iVar22 = look->n;
  if (0 < iVar12) {
    memset(local_1058,0,lVar24 * 4);
    lVar8 = 0;
    do {
      aiStack_116c[lVar8 + 1] = 1;
      lVar8 = lVar8 + 1;
    } while (lVar24 != lVar8);
  }
  if (0 < iVar12) {
    memset(local_f48,0xff,lVar24 * 4);
  }
  local_13f8 = look;
  local_13f0 = logmdct;
  local_13e0 = logmask;
  local_13d8 = pvVar26;
  local_13b8 = vb;
  if (iVar12 == 0) {
    iVar22 = accumulate_fit(logmask,logmdct,0,iVar22,local_e38,iVar22,pvVar26);
    lVar8 = (long)iVar22;
  }
  else if (iVar12 < 2) {
    lVar8 = 0;
  }
  else {
    lVar25 = 1;
    a = local_e38;
    lVar8 = 0;
    do {
      iVar6 = accumulate_fit(local_13e0,logmdct,look->sorted_index[lVar25 + -1],
                             look->sorted_index[lVar25],a,iVar22,local_13d8);
      lVar8 = lVar8 + iVar6;
      lVar25 = lVar25 + 1;
      a = a + 1;
    } while (lVar24 != lVar25);
  }
  pvVar26 = local_13d8;
  if (lVar8 == 0) {
    puVar9 = (uint *)0x0;
  }
  else {
    local_138c = 0xffffff38;
    local_1390 = 0xffffff38;
    fit_line(local_e38,iVar12 + -1,(int *)&local_138c,(int *)&local_1390,local_13d8);
    local_1278[0] = local_138c;
    local_1388[0] = local_138c;
    local_1388[1] = local_1390;
    local_1278[1] = local_1390;
    pvVar16 = local_13f8;
    if (2 < iVar12) {
      lVar8 = 2;
      local_13c0 = lVar24;
      do {
        iVar12 = pvVar16->reverse_index[lVar8];
        lVar25 = (long)iVar12;
        lVar13 = (long)local_1058[lVar25];
        iVar22 = aiStack_116c[lVar25 + 1];
        if (local_f48[lVar13] != iVar22) {
          lVar24 = (long)iVar22;
          iVar6 = pvVar16->reverse_index[lVar13];
          local_13a0 = (long)iVar6;
          local_13c4 = pvVar16->reverse_index[lVar24];
          local_f48[lVar13] = iVar22;
          uVar7 = local_1278[lVar13];
          uVar21 = local_1388[lVar13];
          uVar15 = uVar21;
          if ((-1 < (int)uVar7) && (uVar15 = uVar7, -1 < (int)uVar21)) {
            uVar15 = uVar21 + uVar7 >> 1;
          }
          uVar7 = local_1278[lVar24];
          uVar21 = local_1388[lVar24];
          uVar19 = uVar21;
          if ((-1 < (int)uVar7) && (uVar19 = uVar7, -1 < (int)uVar21)) {
            uVar19 = uVar21 + uVar7 >> 1;
          }
          local_13e8 = lVar8;
          local_13cc = iVar22;
          local_1398 = lVar25;
          if ((uVar15 == 0xffffffff) || (uVar19 == 0xffffffff)) {
            exit(1);
          }
          uVar7 = pvVar26->postlist[lVar13];
          lVar20 = (long)(int)uVar7;
          iVar22 = pvVar26->postlist[lVar24];
          iVar17 = uVar19 - uVar15;
          uVar21 = iVar22 - uVar7;
          iVar4 = -iVar17;
          if (0 < iVar17) {
            iVar4 = iVar17;
          }
          iVar14 = (int)(local_13e0[lVar20] * 7.3142858 + 1023.5);
          if (iVar14 < 1) {
            iVar14 = 0;
          }
          if (0x3fe < iVar14) {
            iVar14 = 0x3ff;
          }
          iVar10 = (iVar17 / (int)uVar21) * uVar21;
          iVar5 = -iVar10;
          if (iVar10 < 1) {
            iVar5 = iVar10;
          }
          pfVar1 = &pvVar26->twofitatten;
          local_1404 = uVar15;
          local_13c8 = uVar19;
          local_13b0 = lVar24;
          local_13a8 = lVar13;
          if (local_13e0[lVar20] <= local_13f0[lVar20] + *pfVar1) {
            if (((float)iVar14 <= pvVar26->maxover + (float)(int)uVar15) &&
               ((float)(int)uVar15 - pvVar26->maxunder <= (float)iVar14)) goto LAB_001dee69;
          }
          else {
LAB_001dee69:
            uVar11 = (uVar15 - iVar14) * (uVar15 - iVar14);
            lVar20 = lVar20 + 1;
            uVar19 = 1;
            if ((int)lVar20 < iVar22) {
              lVar24 = 0;
              iVar14 = 0;
              do {
                iVar14 = iVar14 + iVar4 + iVar5;
                uVar19 = 0;
                uVar18 = 0;
                if ((int)uVar21 <= iVar14) {
                  uVar19 = iVar17 >> 0x1f | 1;
                  uVar18 = uVar21;
                }
                iVar23 = (int)(local_13e0[lVar20 + lVar24] * 7.3142858 + 1023.5);
                iVar10 = iVar23;
                if (iVar23 < 1) {
                  iVar10 = 0;
                }
                if (0x3fe < iVar10) {
                  iVar10 = 0x3ff;
                }
                uVar15 = uVar15 + iVar17 / (int)uVar21 + uVar19;
                pvVar26 = local_13d8;
                if ((local_13e0[lVar20 + lVar24] <= local_13f0[lVar20 + lVar24] + *pfVar1) &&
                   (0 < iVar23)) {
                  if ((local_13d8->maxover + (float)(int)uVar15 < (float)iVar10) ||
                     ((float)iVar10 < (float)(int)uVar15 - local_13d8->maxunder)) goto LAB_001df013;
                }
                iVar14 = iVar14 - uVar18;
                uVar11 = uVar11 + (uVar15 - iVar10) * (uVar15 - iVar10);
                lVar24 = lVar24 + 1;
                uVar19 = uVar21;
              } while (~uVar7 + iVar22 != (int)lVar24);
            }
            fVar2 = pvVar26->maxerr;
            if (((fVar2 < (pvVar26->maxover * pvVar26->maxover) / (float)(int)uVar19) ||
                (fVar2 < (pvVar26->maxunder * pvVar26->maxunder) / (float)(int)uVar19)) ||
               ((float)(int)(uVar11 / uVar19) <= fVar2)) {
              local_1278[lVar8] = 0xffffff38;
              local_1388[lVar8] = 0xffffff38;
              pvVar16 = local_13f8;
              lVar24 = local_13c0;
              goto LAB_001df18d;
            }
          }
LAB_001df013:
          local_13fc = 0xffffff38;
          local_1408 = 0xffffff38;
          local_140c = 0xffffff38;
          local_1400 = 0xffffff38;
          iVar22 = fit_line(local_e38 + local_13a0,iVar12 - iVar6,(int *)&local_13fc,
                            (int *)&local_1408,pvVar26);
          iVar6 = fit_line(local_e38 + lVar25,local_13c4 - iVar12,(int *)&local_140c,
                           (int *)&local_1400,pvVar26);
          if (iVar22 != 0) {
            local_13fc = local_1404;
            local_1408 = local_140c;
          }
          if (iVar6 != 0) {
            local_140c = local_1408;
            local_1400 = local_13c8;
          }
          pvVar16 = local_13f8;
          lVar8 = local_13e8;
          lVar24 = local_13c0;
          if ((iVar22 == 0) || (iVar6 == 0)) {
            local_1388[local_13a8] = local_13fc;
            if ((int)local_13a8 == 0) {
              local_1278[local_13a8] = local_13fc;
            }
            local_1278[local_13e8] = local_1408;
            local_1388[local_13e8] = local_140c;
            local_1278[local_13b0] = local_1400;
            if ((int)local_13b0 == 1) {
              local_1388[local_13b0] = local_1400;
            }
            if (-1 < (int)(local_1408 & local_140c)) {
              lVar13 = lVar25;
              if (0 < iVar12) {
                do {
                  if (aiStack_116c[lVar13] != local_13cc) break;
                  aiStack_116c[lVar13] = (int)local_13e8;
                  lVar20 = lVar13 + -1;
                  bVar3 = 0 < lVar13;
                  lVar13 = lVar20;
                } while (lVar20 != 0 && bVar3);
              }
              lVar25 = lVar25 + 1;
              if ((int)lVar25 < (int)local_13c0) {
                do {
                  if (local_1058[lVar25] != (int)local_13a8) break;
                  local_1058[lVar25] = (int)local_13e8;
                  lVar25 = lVar25 + 1;
                } while (local_13c0 != lVar25);
              }
            }
          }
          else {
            local_1278[local_13e8] = 0xffffff38;
            local_1388[local_13e8] = 0xffffff38;
          }
        }
LAB_001df18d:
        lVar8 = lVar8 + 1;
      } while (lVar8 != lVar24);
    }
    puVar9 = (uint *)_vorbis_block_alloc(local_13b8,lVar24 * 4);
    uVar7 = local_1388[0];
    if ((-1 < (int)local_1278[0]) && (uVar7 = local_1278[0], -1 < (int)local_1388[0])) {
      uVar7 = local_1388[0] + local_1278[0] >> 1;
    }
    *puVar9 = uVar7;
    uVar7 = local_1388[1];
    if ((-1 < (int)local_1278[1]) && (uVar7 = local_1278[1], -1 < (int)local_1388[1])) {
      uVar7 = local_1388[1] + local_1278[1] >> 1;
    }
    puVar9[1] = uVar7;
    if (2 < (int)lVar24) {
      lVar8 = 0;
      do {
        iVar22 = (puVar9[pvVar16->hineighbor[lVar8]] & 0x7fff) -
                 (puVar9[pvVar16->loneighbor[lVar8]] & 0x7fff);
        iVar12 = -iVar22;
        if (0 < iVar22) {
          iVar12 = iVar22;
        }
        iVar6 = ((pvVar26->postlist[lVar8 + 2] - pvVar26->postlist[pvVar16->loneighbor[lVar8]]) *
                iVar12) / (pvVar26->postlist[pvVar16->hineighbor[lVar8]] -
                          pvVar26->postlist[pvVar16->loneighbor[lVar8]]);
        iVar12 = -iVar6;
        if (-1 < iVar22) {
          iVar12 = iVar6;
        }
        uVar7 = local_1278[lVar8 + 2];
        uVar21 = local_1388[lVar8 + 2];
        uVar15 = uVar21;
        if ((-1 < (int)uVar7) && (uVar15 = uVar7, -1 < (int)uVar21)) {
          uVar15 = uVar21 + uVar7 >> 1;
        }
        uVar21 = iVar12 + (puVar9[pvVar16->loneighbor[lVar8]] & 0x7fff);
        uVar19 = uVar21 | 0x8000;
        uVar7 = uVar15;
        if (uVar21 == uVar15) {
          uVar7 = uVar19;
        }
        if ((int)uVar15 < 0) {
          uVar7 = uVar19;
        }
        puVar9[lVar8 + 2] = uVar7;
        lVar8 = lVar8 + 1;
      } while (lVar24 + -2 != lVar8);
    }
  }
  return (int *)puVar9;
}

Assistant:

int *floor1_fit(vorbis_block *vb,vorbis_look_floor1 *look,
                          const float *logmdct,   /* in */
                          const float *logmask){
  long i,j;
  vorbis_info_floor1 *info=look->vi;
  long n=look->n;
  long posts=look->posts;
  long nonzero=0;
  lsfit_acc fits[VIF_POSIT+1];
  int fit_valueA[VIF_POSIT+2]; /* index by range list position */
  int fit_valueB[VIF_POSIT+2]; /* index by range list position */

  int loneighbor[VIF_POSIT+2]; /* sorted index of range list position (+2) */
  int hineighbor[VIF_POSIT+2];
  int *output=NULL;
  int memo[VIF_POSIT+2];

  for(i=0;i<posts;i++)fit_valueA[i]=-200; /* mark all unused */
  for(i=0;i<posts;i++)fit_valueB[i]=-200; /* mark all unused */
  for(i=0;i<posts;i++)loneighbor[i]=0; /* 0 for the implicit 0 post */
  for(i=0;i<posts;i++)hineighbor[i]=1; /* 1 for the implicit post at n */
  for(i=0;i<posts;i++)memo[i]=-1;      /* no neighbor yet */

  /* quantize the relevant floor points and collect them into line fit
     structures (one per minimal division) at the same time */
  if(posts==0){
    nonzero+=accumulate_fit(logmask,logmdct,0,n,fits,n,info);
  }else{
    for(i=0;i<posts-1;i++)
      nonzero+=accumulate_fit(logmask,logmdct,look->sorted_index[i],
                              look->sorted_index[i+1],fits+i,
                              n,info);
  }

  if(nonzero){
    /* start by fitting the implicit base case.... */
    int y0=-200;
    int y1=-200;
    fit_line(fits,posts-1,&y0,&y1,info);

    fit_valueA[0]=y0;
    fit_valueB[0]=y0;
    fit_valueB[1]=y1;
    fit_valueA[1]=y1;

    /* Non degenerate case */
    /* start progressive splitting.  This is a greedy, non-optimal
       algorithm, but simple and close enough to the best
       answer. */
    for(i=2;i<posts;i++){
      int sortpos=look->reverse_index[i];
      int ln=loneighbor[sortpos];
      int hn=hineighbor[sortpos];

      /* eliminate repeat searches of a particular range with a memo */
      if(memo[ln]!=hn){
        /* haven't performed this error search yet */
        int lsortpos=look->reverse_index[ln];
        int hsortpos=look->reverse_index[hn];
        memo[ln]=hn;

        {
          /* A note: we want to bound/minimize *local*, not global, error */
          int lx=info->postlist[ln];
          int hx=info->postlist[hn];
          int ly=post_Y(fit_valueA,fit_valueB,ln);
          int hy=post_Y(fit_valueA,fit_valueB,hn);

          if(ly==-1 || hy==-1){
            exit(1);
          }

          if(inspect_error(lx,hx,ly,hy,logmask,logmdct,info)){
            /* outside error bounds/begin search area.  Split it. */
            int ly0=-200;
            int ly1=-200;
            int hy0=-200;
            int hy1=-200;
            int ret0=fit_line(fits+lsortpos,sortpos-lsortpos,&ly0,&ly1,info);
            int ret1=fit_line(fits+sortpos,hsortpos-sortpos,&hy0,&hy1,info);

            if(ret0){
              ly0=ly;
              ly1=hy0;
            }
            if(ret1){
              hy0=ly1;
              hy1=hy;
            }

            if(ret0 && ret1){
              fit_valueA[i]=-200;
              fit_valueB[i]=-200;
            }else{
              /* store new edge values */
              fit_valueB[ln]=ly0;
              if(ln==0)fit_valueA[ln]=ly0;
              fit_valueA[i]=ly1;
              fit_valueB[i]=hy0;
              fit_valueA[hn]=hy1;
              if(hn==1)fit_valueB[hn]=hy1;

              if(ly1>=0 || hy0>=0){
                /* store new neighbor values */
                for(j=sortpos-1;j>=0;j--)
                  if(hineighbor[j]==hn)
                    hineighbor[j]=i;
                  else
                    break;
                for(j=sortpos+1;j<posts;j++)
                  if(loneighbor[j]==ln)
                    loneighbor[j]=i;
                  else
                    break;
              }
            }
          }else{
            fit_valueA[i]=-200;
            fit_valueB[i]=-200;
          }
        }
      }
    }

    output=_vorbis_block_alloc(vb,sizeof(*output)*posts);

    output[0]=post_Y(fit_valueA,fit_valueB,0);
    output[1]=post_Y(fit_valueA,fit_valueB,1);

    /* fill in posts marked as not using a fit; we will zero
       back out to 'unused' when encoding them so long as curve
       interpolation doesn't force them into use */
    for(i=2;i<posts;i++){
      int ln=look->loneighbor[i-2];
      int hn=look->hineighbor[i-2];
      int x0=info->postlist[ln];
      int x1=info->postlist[hn];
      int y0=output[ln];
      int y1=output[hn];

      int predicted=render_point(x0,x1,y0,y1,info->postlist[i]);
      int vx=post_Y(fit_valueA,fit_valueB,i);

      if(vx>=0 && predicted!=vx){
        output[i]=vx;
      }else{
        output[i]= predicted|0x8000;
      }
    }
  }

  return(output);

}